

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  Vector VVar1;
  double *pdVar2;
  int64_t *piVar3;
  timestamp_t *ptVar4;
  optional_idx sel_vector;
  idx_t iVar5;
  Vector *vector;
  SelectionVector *pSVar6;
  SelectionVector *pSVar7;
  VectorType VVar8;
  double dVar9;
  optional_idx dict_size;
  timestamp_t *local_70;
  ValidityMask local_68;
  
  VVar1 = *input;
  VVar8 = (VectorType)result;
  if (VVar1 == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar8);
    pdVar2 = *(double **)(result + 0x20);
    ptVar4 = *(timestamp_t **)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
              (ptVar4,pdVar2,count,(ValidityMask *)(input + 0x28),(ValidityMask *)(result + 0x28),
               dataptr,adds_nulls);
  }
  else {
    if (VVar1 == (Vector)0x3) {
      if ((((errors == CANNOT_ERROR) &&
           (dict_size = DictionaryVector::DictionarySize(input),
           dict_size.index != 0xffffffffffffffff)) &&
          (iVar5 = optional_idx::GetIndex(&dict_size), iVar5 * 2 <= count)) &&
         (vector = DictionaryVector::Child(input), *vector == (Vector)0x0)) {
        pdVar2 = *(double **)(result + 0x20);
        ptVar4 = *(timestamp_t **)(vector + 0x20);
        iVar5 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        ExecuteFlat<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
                  (ptVar4,pdVar2,iVar5,(ValidityMask *)(vector + 0x28),
                   (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
        pSVar6 = DictionaryVector::SelVector(input);
        pSVar7 = (SelectionVector *)optional_idx::GetIndex(&dict_size);
        duckdb::Vector::Dictionary(result,(ulong)result,pSVar7,(ulong)pSVar6);
        return;
      }
    }
    else if (VVar1 == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar8);
      pdVar2 = *(double **)(result + 0x20);
      piVar3 = *(int64_t **)(input + 0x20);
      if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      dVar9 = DatePart::PartOperator<duckdb::DatePart::EpochOperator>::
              Operation<duckdb::timestamp_t,double>
                        ((timestamp_t)*piVar3,(ValidityMask *)(result + 0x28),0,dataptr);
      *pdVar2 = dVar9;
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar8);
    sel_vector = dict_size;
    pdVar2 = *(double **)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
              (local_70,pdVar2,count,(SelectionVector *)sel_vector.index,&local_68,
               (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}